

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool Diligent::ModifyPipelineStateCreateInfo<Diligent::TilePipelineStateCreateInfo>
               (TilePipelineStateCreateInfo *CreateInfo,PipelineStateUnpackInfo *UnpackInfo)

{
  PIPELINE_TYPE PVar1;
  uint uVar2;
  IPipelineResourceSignature **__first;
  value_type pIVar3;
  ulong uVar4;
  ShaderResourceVariableDesc *__first_00;
  ulong uVar5;
  undefined *puVar6;
  bool bVar7;
  int iVar8;
  Char *pCVar9;
  ImmutableSamplerDesc *pIVar10;
  undefined8 uVar11;
  size_type sVar12;
  reference ppIVar13;
  undefined4 extraout_var;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar14;
  undefined1 local_278 [8];
  string _msg_5;
  PipelineResourceSignatureDesc *NewDesc;
  PipelineResourceSignatureDesc *OrigDesc;
  string _msg_4;
  IPipelineResourceSignature *pNewSign;
  IPipelineResourceSignature *pOrigSign;
  size_t sign;
  string _msg_3;
  string _msg_2;
  size_t i;
  string _msg_1;
  undefined1 local_1a0 [8];
  string _msg;
  undefined1 local_178 [8];
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  pSignatures;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_150;
  undefined1 local_148;
  reference local_140;
  ImmutableSamplerDesc *Sam;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  *__range2_1;
  undefined1 local_118 [8];
  vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ImmutableSamplers;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  undefined1 local_e8;
  reference local_e0;
  ShaderResourceVariableDesc *Var;
  iterator __end2;
  iterator __begin2;
  vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  *__range2;
  allocator<Diligent::ShaderResourceVariableDesc> local_a9;
  undefined1 local_a8 [8];
  vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  Variables;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Strings;
  PipelineResourceLayoutDesc ResourceLayout;
  PIPELINE_TYPE PipelineType;
  PipelineStateUnpackInfo *UnpackInfo_local;
  TilePipelineStateCreateInfo *CreateInfo_local;
  
  if (UnpackInfo->ModifyPipelineStateCreateInfo ==
      (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) {
    CreateInfo_local._7_1_ = true;
  }
  else {
    PVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
    pIVar10 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.ImmutableSamplers;
    Strings._M_h._M_single_bucket =
         *(__node_base_ptr *)&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout;
    uVar4 = *(ulong *)&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.
                       NumVariables;
    __first_00 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.Variables;
    uVar5 = *(ulong *)&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.
                       NumImmutableSamplers;
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&Variables.
                        super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<Diligent::ShaderResourceVariableDesc>::allocator(&local_a9);
    std::
    vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
    ::vector<Diligent::ShaderResourceVariableDesc_const*,void>
              ((vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
                *)local_a8,__first_00,__first_00 + (uVar4 & 0xffffffff),&local_a9);
    std::allocator<Diligent::ShaderResourceVariableDesc>::~allocator(&local_a9);
    __end2 = std::
             vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
             ::begin((vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                      *)local_a8);
    Var = (ShaderResourceVariableDesc *)
          std::
          vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
          ::end((vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                 *)local_a8);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Diligent::ShaderResourceVariableDesc_*,_std::vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>_>
                                       *)&Var), bVar7) {
      local_e0 = __gnu_cxx::
                 __normal_iterator<Diligent::ShaderResourceVariableDesc_*,_std::vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>_>
                 ::operator*(&__end2);
      pVar14 = std::
               unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::emplace<char_const*&>
                         ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&Variables.
                              super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_e0->Name);
      ImmutableSamplers.
      super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar14.first.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur;
      local_e8 = pVar14.second;
      local_f0._M_cur =
           (__node_type *)
           ImmutableSamplers.
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_f0);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      local_e0->Name = pCVar9;
      __gnu_cxx::
      __normal_iterator<Diligent::ShaderResourceVariableDesc_*,_std::vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>_>
      ::operator++(&__end2);
    }
    std::allocator<Diligent::ImmutableSamplerDesc>::allocator
              ((allocator<Diligent::ImmutableSamplerDesc> *)((long)&__range2_1 + 7));
    std::vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>::
    vector<Diligent::ImmutableSamplerDesc_const*,void>
              ((vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>
                *)local_118,pIVar10,pIVar10 + (uVar5 & 0xffffffff),
               (allocator<Diligent::ImmutableSamplerDesc> *)((long)&__range2_1 + 7));
    std::allocator<Diligent::ImmutableSamplerDesc>::~allocator
              ((allocator<Diligent::ImmutableSamplerDesc> *)((long)&__range2_1 + 7));
    __end2_1 = std::
               vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
               ::begin((vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                        *)local_118);
    Sam = (ImmutableSamplerDesc *)
          std::
          vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
          end((vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
               *)local_118);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Diligent::ImmutableSamplerDesc_*,_std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>_>
                               *)&Sam), bVar7) {
      local_140 = __gnu_cxx::
                  __normal_iterator<Diligent::ImmutableSamplerDesc_*,_std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>_>
                  ::operator*(&__end2_1);
      pVar14 = std::
               unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::emplace<char_const*&>
                         ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&Variables.
                              super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          &local_140->SamplerOrTextureName);
      pSignatures.
      super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar14.first.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur;
      local_148 = pVar14.second;
      local_150._M_cur =
           (__node_type *)
           pSignatures.
           super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_150);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      local_140->SamplerOrTextureName = pCVar9;
      __gnu_cxx::
      __normal_iterator<Diligent::ImmutableSamplerDesc_*,_std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
    ::data((vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
            *)local_a8);
    pIVar10 = std::
              vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
              ::data((vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                      *)local_118);
    __first = (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures;
    uVar2 = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
    std::allocator<Diligent::IPipelineResourceSignature_*>::allocator
              ((allocator<Diligent::IPipelineResourceSignature_*> *)
               (_msg.field_2._M_local_buf + 0xf));
    std::
    vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
    ::vector<Diligent::IPipelineResourceSignature**,void>
              ((vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
                *)local_178,__first,__first + uVar2,
               (allocator<Diligent::IPipelineResourceSignature_*> *)
               (_msg.field_2._M_local_buf + 0xf));
    std::allocator<Diligent::IPipelineResourceSignature_*>::~allocator
              ((allocator<Diligent::IPipelineResourceSignature_*> *)
               (_msg.field_2._M_local_buf + 0xf));
    (*UnpackInfo->ModifyPipelineStateCreateInfo)
              (&CreateInfo->super_PipelineStateCreateInfo,UnpackInfo->pUserData);
    if (PVar1 == (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType) {
      bVar7 = PipelineResourceLayoutDesc::IsEqual
                        ((PipelineResourceLayoutDesc *)&Strings._M_h._M_single_bucket,
                         &(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,false,
                         true);
      if (bVar7) {
        for (_msg_2.field_2._8_8_ = 0; (ulong)_msg_2.field_2._8_8_ < (uVar5 & 0xffffffff);
            _msg_2.field_2._8_8_ = _msg_2.field_2._8_8_ + 1) {
          if (pIVar10[_msg_2.field_2._8_8_].ShaderStages !=
              (CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.ImmutableSamplers
              [_msg_2.field_2._8_8_].ShaderStages) {
            FormatString<char[80]>
                      ((string *)((long)&_msg_3.field_2 + 8),
                       (char (*) [80])
                       "Modifying immutable sampler shader stages in the resource layout is not allowed"
                      );
            puVar6 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar11 = std::__cxx11::string::c_str();
              (*(code *)puVar6)(2,uVar11,0);
            }
            std::__cxx11::string::~string((string *)(_msg_3.field_2._M_local_buf + 8));
            CreateInfo_local._7_1_ = false;
            goto LAB_00717c9a;
          }
        }
        sVar12 = std::
                 vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                 ::size((vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                         *)local_178);
        if (sVar12 == (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount) {
          for (pOrigSign = (IPipelineResourceSignature *)0x0;
              pOrigSign <
              (IPipelineResourceSignature *)
              (ulong)(CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
              pOrigSign = (IPipelineResourceSignature *)
                          ((long)&(pOrigSign->super_IDeviceObject).super_IObject._vptr_IObject + 1))
          {
            ppIVar13 = std::
                       vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                       ::operator[]((vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                                     *)local_178,(size_type)pOrigSign);
            pIVar3 = *ppIVar13;
            _msg_4.field_2._8_8_ =
                 (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures[(long)pOrigSign];
            if (pIVar3 != (value_type)_msg_4.field_2._8_8_) {
              if ((pIVar3 == (value_type)0x0) !=
                  ((value_type)_msg_4.field_2._8_8_ == (value_type)0x0)) {
                FormatString<char[75]>
                          ((string *)&OrigDesc,
                           (char (*) [75])
                           "Changing non-null resource signature to null and vice versa is not allowed"
                          );
                puVar6 = DebugMessageCallback;
                if (DebugMessageCallback != (undefined *)0x0) {
                  uVar11 = std::__cxx11::string::c_str();
                  (*(code *)puVar6)(2,uVar11,0);
                }
                std::__cxx11::string::~string((string *)&OrigDesc);
                CreateInfo_local._7_1_ = false;
                goto LAB_00717c9a;
              }
              if ((pIVar3 != (value_type)0x0) &&
                 ((value_type)_msg_4.field_2._8_8_ != (value_type)0x0)) {
                iVar8 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
                _msg_5.field_2._8_8_ = (**(code **)(*(long *)_msg_4.field_2._8_8_ + 0x20))();
                bVar7 = PipelineResourceSignaturesCompatible
                                  ((PipelineResourceSignatureDesc *)CONCAT44(extraout_var,iVar8),
                                   (PipelineResourceSignatureDesc *)_msg_5.field_2._8_8_,true);
                if (!bVar7) {
                  FormatString<char[134]>
                            ((string *)local_278,
                             (char (*) [134])
                             "When changing pipeline resource signatures, only immutable sampler descriptions in new signatures are allowed to differ from original"
                            );
                  puVar6 = DebugMessageCallback;
                  if (DebugMessageCallback != (undefined *)0x0) {
                    uVar11 = std::__cxx11::string::c_str();
                    (*(code *)puVar6)(2,uVar11,0);
                  }
                  std::__cxx11::string::~string((string *)local_278);
                  CreateInfo_local._7_1_ = false;
                  goto LAB_00717c9a;
                }
              }
            }
          }
          CreateInfo_local._7_1_ = true;
        }
        else {
          FormatString<char[58]>
                    ((string *)&sign,
                     (char (*) [58])"Changing the number of resource signatures is not allowed");
          puVar6 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar11 = std::__cxx11::string::c_str();
            (*(code *)puVar6)(2,uVar11,0);
          }
          std::__cxx11::string::~string((string *)&sign);
          CreateInfo_local._7_1_ = false;
        }
      }
      else {
        FormatString<char[84]>
                  ((string *)&i,
                   (char (*) [84])
                   "Only immutable sampler descriptions in the pipeline resource layout can be modified"
                  );
        puVar6 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar11 = std::__cxx11::string::c_str();
          (*(code *)puVar6)(2,uVar11,0);
        }
        std::__cxx11::string::~string((string *)&i);
        CreateInfo_local._7_1_ = false;
      }
    }
    else {
      FormatString<char[39]>
                ((string *)local_1a0,(char (*) [39])"Modifying pipeline type is not allowed");
      puVar6 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        (*(code *)puVar6)(2,uVar11,0);
      }
      std::__cxx11::string::~string((string *)local_1a0);
      CreateInfo_local._7_1_ = false;
    }
LAB_00717c9a:
    _msg_1.field_2._12_4_ = 1;
    std::
    vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
    ::~vector((vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
               *)local_178);
    std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
    ~vector((vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             *)local_118);
    std::
    vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
    ::~vector((vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
               *)local_a8);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&Variables.
                         super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return CreateInfo_local._7_1_;
}

Assistant:

static bool ModifyPipelineStateCreateInfo(PSOCreateInfoType&             CreateInfo,
                                          const PipelineStateUnpackInfo& UnpackInfo)
{
    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
        return true;

    const PIPELINE_TYPE PipelineType = CreateInfo.PSODesc.PipelineType;

    PipelineResourceLayoutDesc ResourceLayout = CreateInfo.PSODesc.ResourceLayout;

    std::unordered_set<std::string> Strings;

    std::vector<ShaderResourceVariableDesc> Variables{ResourceLayout.Variables, ResourceLayout.Variables + ResourceLayout.NumVariables};
    for (ShaderResourceVariableDesc& Var : Variables)
        Var.Name = Strings.emplace(Var.Name).first->c_str();

    std::vector<ImmutableSamplerDesc> ImmutableSamplers{ResourceLayout.ImmutableSamplers, ResourceLayout.ImmutableSamplers + ResourceLayout.NumImmutableSamplers};
    for (ImmutableSamplerDesc& Sam : ImmutableSamplers)
        Sam.SamplerOrTextureName = Strings.emplace(Sam.SamplerOrTextureName).first->c_str();

    ResourceLayout.Variables         = Variables.data();
    ResourceLayout.ImmutableSamplers = ImmutableSamplers.data();

    std::vector<IPipelineResourceSignature*> pSignatures{CreateInfo.ppResourceSignatures, CreateInfo.ppResourceSignatures + CreateInfo.ResourceSignaturesCount};

    UnpackInfo.ModifyPipelineStateCreateInfo(CreateInfo, UnpackInfo.pUserData);

    if (PipelineType != CreateInfo.PSODesc.PipelineType)
    {
        LOG_ERROR_MESSAGE("Modifying pipeline type is not allowed");
        return false;
    }

    if (!PipelineResourceLayoutDesc::IsEqual(ResourceLayout, CreateInfo.PSODesc.ResourceLayout, /*IgnoreVariables = */ false, /*IgnoreSamplers = */ true))
    {
        LOG_ERROR_MESSAGE("Only immutable sampler descriptions in the pipeline resource layout can be modified");
        return false;
    }

    for (size_t i = 0; i < ResourceLayout.NumImmutableSamplers; ++i)
    {
        // Immutable sampler descriptions can be modified, but shader stages must be the same
        if (ResourceLayout.ImmutableSamplers[i].ShaderStages != CreateInfo.PSODesc.ResourceLayout.ImmutableSamplers[i].ShaderStages)
        {
            LOG_ERROR_MESSAGE("Modifying immutable sampler shader stages in the resource layout is not allowed");
            return false;
        }
    }

    if (pSignatures.size() != CreateInfo.ResourceSignaturesCount)
    {
        LOG_ERROR_MESSAGE("Changing the number of resource signatures is not allowed");
        return false;
    }

    for (size_t sign = 0; sign < CreateInfo.ResourceSignaturesCount; ++sign)
    {
        const IPipelineResourceSignature* pOrigSign = pSignatures[sign];
        const IPipelineResourceSignature* pNewSign  = CreateInfo.ppResourceSignatures[sign];
        if (pOrigSign == pNewSign)
            continue;
        if ((pOrigSign == nullptr) != (pNewSign == nullptr))
        {
            LOG_ERROR_MESSAGE("Changing non-null resource signature to null and vice versa is not allowed");
            return false;
        }
        if ((pOrigSign == nullptr) || (pNewSign == nullptr))
        {
            // This may never happen, but let's make static analyzers happy
            continue;
        }

        const PipelineResourceSignatureDesc& OrigDesc = pOrigSign->GetDesc();
        const PipelineResourceSignatureDesc& NewDesc  = pNewSign->GetDesc();
        if (!PipelineResourceSignaturesCompatible(OrigDesc, NewDesc, /*IgnoreSamplerDescriptions =*/true))
        {
            LOG_ERROR_MESSAGE("When changing pipeline resource signatures, only immutable sampler descriptions in new signatures are allowed to differ from original");
            return false;
        }
    }

    return true;
}